

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

void duckdb::DatePartCachedFunction<duckdb::DatePart::MonthOperator,duckdb::date_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *pVVar1;
  ulong *puVar2;
  UnifiedVectorFormat *pUVar3;
  int64_t *piVar4;
  int32_t *piVar5;
  long lVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  byte bVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar11;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar12;
  reference vector;
  UnifiedVectorFormat *pUVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  int64_t iVar15;
  ulong uVar16;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar17;
  VectorType VVar18;
  ulong uVar19;
  UnifiedVectorFormat *pUVar20;
  UnifiedVectorFormat *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  reference local_90;
  ulong local_88;
  unsigned_long local_80;
  optional_ptr<duckdb::FunctionLocalState,_true> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_78.ptr = *(FunctionLocalState **)(state + 0xb0);
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&local_78);
  oVar11.ptr = local_78.ptr;
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  pUVar3 = *(UnifiedVectorFormat **)(args + 0x18);
  VVar18 = (VectorType)result;
  if (*vector == (value_type)0x0) {
    duckdb::Vector::SetVectorType(VVar18);
    lVar6 = *(long *)(result + 0x20);
    lVar7 = *(long *)(vector + 0x20);
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    pVVar1 = result + 0x28;
    if (*(long *)(vector + 0x28) == 0) {
      if (pUVar3 != (UnifiedVectorFormat *)0x0) {
        pUVar17 = (UnifiedVectorFormat *)0x0;
        do {
          iVar15 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::MonthOperator> *)(oVar11.ptr + 8),
                              (date_t)*(int32_t *)(lVar7 + (long)pUVar17 * 4),(ValidityMask *)pVVar1
                              ,(idx_t)pUVar17);
          *(int64_t *)(lVar6 + (long)pUVar17 * 8) = iVar15;
          pUVar17 = pUVar17 + 1;
        } while (pUVar3 != pUVar17);
      }
    }
    else {
      *(UnifiedVectorFormat **)(result + 0x40) = pUVar3;
      local_a8 = pUVar3;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)(vector + 0x28),(unsigned_long *)&local_a8);
      p_Var10 = p_Stack_70;
      oVar12.ptr = local_78.ptr;
      local_78.ptr = (FunctionLocalState *)0x0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
      *(FunctionLocalState **)(result + 0x30) = oVar12.ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
      }
      if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      }
      pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (result + 0x30));
      *(unsigned_long **)pVVar1 =
           (unsigned_long *)
           (pTVar14->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      if ((UnifiedVectorFormat *)0x3f < pUVar3 + 0x3f) {
        local_88 = 0;
        pUVar17 = (UnifiedVectorFormat *)0x0;
        local_90 = vector + 0x28;
        do {
          if (*(long *)local_90 == 0) {
            uVar16 = 0xffffffffffffffff;
          }
          else {
            uVar16 = *(ulong *)(*(long *)local_90 + local_88 * 8);
          }
          pUVar13 = pUVar17 + 0x40;
          if (pUVar3 <= pUVar17 + 0x40) {
            pUVar13 = pUVar3;
          }
          pUVar20 = pUVar13;
          if (uVar16 != 0) {
            pUVar20 = pUVar17;
            if (uVar16 == 0xffffffffffffffff) {
              if (pUVar17 < pUVar13) {
                do {
                  iVar15 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                                     ((DateLookupCache<duckdb::DatePart::MonthOperator> *)
                                      (oVar11.ptr + 8),
                                      (date_t)*(int32_t *)(lVar7 + (long)pUVar20 * 4),
                                      (ValidityMask *)pVVar1,(idx_t)pUVar20);
                  *(int64_t *)(lVar6 + (long)pUVar20 * 8) = iVar15;
                  pUVar20 = pUVar20 + 1;
                } while (pUVar13 != pUVar20);
              }
            }
            else if (pUVar17 < pUVar13) {
              uVar19 = 0;
              do {
                if ((uVar16 >> (uVar19 & 0x3f) & 1) != 0) {
                  iVar15 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                                     ((DateLookupCache<duckdb::DatePart::MonthOperator> *)
                                      (oVar11.ptr + 8),
                                      (date_t)*(int32_t *)(lVar7 + (long)pUVar17 * 4 + uVar19 * 4),
                                      (ValidityMask *)pVVar1,(idx_t)(pUVar17 + uVar19));
                  *(int64_t *)(lVar6 + (long)pUVar17 * 8 + uVar19 * 8) = iVar15;
                }
                uVar19 = uVar19 + 1;
              } while (pUVar17 + (uVar19 - (long)pUVar13) != (UnifiedVectorFormat *)0x0);
              pUVar20 = pUVar17 + uVar19;
            }
          }
          local_88 = local_88 + 1;
          pUVar17 = pUVar20;
        } while (local_88 != (ulong)(pUVar3 + 0x3f) >> 6);
      }
    }
  }
  else if (*vector == (value_type)0x2) {
    duckdb::Vector::SetVectorType(VVar18);
    piVar4 = *(int64_t **)(result + 0x20);
    piVar5 = *(int32_t **)(vector + 0x20);
    if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      iVar15 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                         ((DateLookupCache<duckdb::DatePart::MonthOperator> *)(oVar11.ptr + 8),
                          (date_t)*piVar5,(ValidityMask *)(result + 0x28),0);
      *piVar4 = iVar15;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar3);
    duckdb::Vector::SetVectorType(VVar18);
    oVar12.ptr = local_78.ptr;
    lVar6 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    pVVar1 = result + 0x28;
    if (local_68 == 0) {
      if (pUVar3 != (UnifiedVectorFormat *)0x0) {
        lVar7 = *(long *)oVar12.ptr;
        pUVar17 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar13 = pUVar17;
          if (lVar7 != 0) {
            pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar17 * 4);
          }
          iVar15 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::MonthOperator> *)(oVar11.ptr + 8),
                              (date_t)*(int32_t *)((long)p_Stack_70 + (long)pUVar13 * 4),
                              (ValidityMask *)pVVar1,(idx_t)pUVar17);
          *(int64_t *)(lVar6 + (long)pUVar17 * 8) = iVar15;
          pUVar17 = pUVar17 + 1;
        } while (pUVar3 != pUVar17);
      }
    }
    else if (pUVar3 != (UnifiedVectorFormat *)0x0) {
      lVar7 = *(long *)oVar12.ptr;
      pUVar17 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar13 = pUVar17;
        if (lVar7 != 0) {
          pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar17 * 4);
        }
        if ((*(ulong *)(local_68 + ((ulong)pUVar13 >> 6) * 8) >> ((ulong)pUVar13 & 0x3f) & 1) == 0)
        {
          if (*(long *)pVVar1 == 0) {
            local_80 = *(unsigned_long *)(result + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var10 = p_Stack_a0;
            pUVar13 = local_a8;
            local_a8 = (UnifiedVectorFormat *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(UnifiedVectorFormat **)(result + 0x30) = pUVar13;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
            }
            if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            *(unsigned_long **)pVVar1 =
                 (unsigned_long *)
                 (pTVar14->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar9 = (byte)pUVar17 & 0x3f;
          puVar2 = (ulong *)(*(long *)pVVar1 + ((ulong)pUVar17 >> 6) * 8);
          *puVar2 = *puVar2 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
        }
        else {
          iVar15 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::MonthOperator> *)(oVar11.ptr + 8),
                              (date_t)*(int32_t *)((long)p_Stack_70 + (long)pUVar13 * 4),
                              (ValidityMask *)pVVar1,(idx_t)pUVar17);
          *(int64_t *)(lVar6 + (long)pUVar17 * 8) = iVar15;
        }
        pUVar17 = pUVar17 + 1;
      } while (pUVar3 != pUVar17);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void DatePartCachedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<DateCacheLocalState<OP>>();
	UnaryExecutor::ExecuteWithNulls<T, int64_t>(
	    args.data[0], result, args.size(),
	    [&](T input, ValidityMask &mask, idx_t idx) { return lstate.cache.ExtractElement(input, mask, idx); });
}